

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadContents(ColladaParser *this)

{
  int iVar1;
  uint uVar2;
  ai_uint32 aVar3;
  undefined4 extraout_var;
  Logger *pLVar4;
  undefined4 extraout_var_00;
  ostream *poVar5;
  undefined4 extraout_var_01;
  size_t sVar6;
  char *pcVar7;
  aiString v;
  char *local_460;
  long *local_458;
  long local_448 [2];
  aiString local_438;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 != '\0') {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar1 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"COLLADA");
        if (iVar1 == 0) {
          uVar2 = TestAttribute(this,"version");
          if (uVar2 != 0xffffffff) {
            iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar2);
            pcVar7 = (char *)CONCAT44(extraout_var_01,iVar1);
            local_438.length = 0;
            local_438.data[0] = '\0';
            memset(local_438.data + 1,0x1b,0x3ff);
            sVar6 = strlen(pcVar7);
            aVar3 = (ai_uint32)sVar6;
            if ((int)aVar3 < 0x400) {
              local_438.length = aVar3;
              memcpy(local_438.data,pcVar7,(long)(int)aVar3);
              local_438.data[(int)aVar3] = '\0';
            }
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
            ::_M_emplace_unique<char_const(&)[26],aiString&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,aiString>,std::_Select1st<std::pair<std::__cxx11::string_const,aiString>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,aiString>>>
                        *)&this->mAssetMetaData,(char (*) [26])"SourceAsset_FormatVersion",
                       &local_438);
            iVar1 = strncmp(pcVar7,"1.5",3);
            if (iVar1 == 0) {
              this->mFormat = FV_1_5_n;
              pcVar7 = "Collada schema version is 1.5.n";
            }
            else {
              iVar1 = strncmp(pcVar7,"1.4",3);
              if (iVar1 == 0) {
                this->mFormat = FV_1_4_n;
                pcVar7 = "Collada schema version is 1.4.n";
              }
              else {
                iVar1 = strncmp(pcVar7,"1.3",3);
                if (iVar1 != 0) goto LAB_0042f72a;
                this->mFormat = FV_1_3_n;
                pcVar7 = "Collada schema version is 1.3.n";
              }
            }
            pLVar4 = DefaultLogger::get();
            Logger::debug(pLVar4,pcVar7);
          }
LAB_0042f72a:
          ReadStructure(this);
        }
        else {
          pLVar4 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[26]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_438,(char (*) [26])"Ignoring global element <");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          local_460 = (char *)CONCAT44(extraout_var_00,iVar1);
          poVar5 = (ostream *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_438,&local_460);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,">.",2);
          std::__cxx11::stringbuf::str();
          Logger::debug(pLVar4,(char *)local_458);
          if (local_458 != local_448) {
            operator_delete(local_458,local_448[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
          std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
          SkipElement(this);
        }
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadContents()
{
    while (mReader->read())
    {
        // handle the root element "COLLADA"
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("COLLADA"))
            {
                // check for 'version' attribute
                const int attrib = TestAttribute("version");
                if (attrib != -1) {
                    const char* version = mReader->getAttributeValue(attrib);

                    // Store declared format version string
                    aiString v;
                    v.Set(version);
                    mAssetMetaData.emplace(AI_METADATA_SOURCE_FORMAT_VERSION, v );

                    if (!::strncmp(version, "1.5", 3)) {
                        mFormat = FV_1_5_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.5.n");
                    }
                    else if (!::strncmp(version, "1.4", 3)) {
                        mFormat = FV_1_4_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.4.n");
                    }
                    else if (!::strncmp(version, "1.3", 3)) {
                        mFormat = FV_1_3_n;
                        ASSIMP_LOG_DEBUG("Collada schema version is 1.3.n");
                    }
                }

                ReadStructure();
            }
            else
            {
                ASSIMP_LOG_DEBUG_F("Ignoring global element <", mReader->getNodeName(), ">.");
                SkipElement();
            }
        }
        else
        {
            // skip everything else silently
        }
    }
}